

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldOptions::SerializeWithCachedSizes
          (FieldOptions *this,CodedOutputStream *output)

{
  bool bVar1;
  FieldOptions_CType value;
  int iVar2;
  char *data;
  string *value_00;
  UninterpretedOption *value_01;
  UnknownFieldSet *pUVar3;
  int local_1c;
  int i;
  CodedOutputStream *output_local;
  FieldOptions *this_local;
  
  bVar1 = has_ctype(this);
  if (bVar1) {
    value = ctype(this);
    internal::WireFormatLite::WriteEnum(1,value,output);
  }
  bVar1 = has_packed(this);
  if (bVar1) {
    bVar1 = packed(this);
    internal::WireFormatLite::WriteBool(2,bVar1,output);
  }
  bVar1 = has_deprecated(this);
  if (bVar1) {
    bVar1 = deprecated(this);
    internal::WireFormatLite::WriteBool(3,bVar1,output);
  }
  bVar1 = has_lazy(this);
  if (bVar1) {
    bVar1 = lazy(this);
    internal::WireFormatLite::WriteBool(5,bVar1,output);
  }
  bVar1 = has_experimental_map_key(this);
  if (bVar1) {
    experimental_map_key_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    experimental_map_key_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(data,iVar2,SERIALIZE);
    value_00 = experimental_map_key_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(9,value_00,output);
  }
  bVar1 = has_weak(this);
  if (bVar1) {
    bVar1 = weak(this);
    internal::WireFormatLite::WriteBool(10,bVar1,output);
  }
  for (local_1c = 0; iVar2 = uninterpreted_option_size(this), local_1c < iVar2;
      local_1c = local_1c + 1) {
    value_01 = uninterpreted_option(this,local_1c);
    internal::WireFormatLite::WriteMessageMaybeToArray(999,(MessageLite *)value_01,output);
  }
  internal::ExtensionSet::SerializeWithCachedSizes(&this->_extensions_,1000,0x20000000,output);
  pUVar3 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar3);
  if (!bVar1) {
    pUVar3 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar3,output);
  }
  return;
}

Assistant:

void FieldOptions::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
  if (has_ctype()) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->ctype(), output);
  }

  // optional bool packed = 2;
  if (has_packed()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->packed(), output);
  }

  // optional bool deprecated = 3 [default = false];
  if (has_deprecated()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->deprecated(), output);
  }

  // optional bool lazy = 5 [default = false];
  if (has_lazy()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(5, this->lazy(), output);
  }

  // optional string experimental_map_key = 9;
  if (has_experimental_map_key()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->experimental_map_key().data(), this->experimental_map_key().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      9, this->experimental_map_key(), output);
  }

  // optional bool weak = 10 [default = false];
  if (has_weak()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(10, this->weak(), output);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      999, this->uninterpreted_option(i), output);
  }

  // Extension range [1000, 536870912)
  _extensions_.SerializeWithCachedSizes(
      1000, 536870912, output);

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}